

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitLaneIndex(WasmBytecodeGenerator *this,OpCodeAsmJs op)

{
  uint index;
  WasmBinaryReader *pWVar1;
  EmitInfo EVar2;
  undefined8 in_RCX;
  WasmConstLitNode cnst;
  
  pWVar1 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar1 == (WasmBinaryReader *)0x0) {
    pWVar1 = (this->m_module->m_reader).ptr;
  }
  index = (pWVar1->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  cnst.field_0.v128[1] = 0;
  cnst.field_0.v128[0] = index;
  CheckLaneIndex(this,op,index);
  cnst.field_0._8_8_ = in_RCX;
  EVar2 = EmitConst(this,FirstLocalType,cnst);
  return EVar2;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitLaneIndex(Js::OpCodeAsmJs op)
{
    const uint index = GetReader()->m_currentNode.lane.index;
    CheckLaneIndex(op, index);
    WasmConstLitNode dummy;
    dummy.i32 = index;
    return EmitConst(WasmTypes::I32, dummy);
}